

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibtexreader.hpp
# Opt level: O2

bool bibtex::
     read<char,std::char_traits<char>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
               (basic_istream<char,_std::char_traits<char>_> *in,
               vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_> *entries)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  mStack_48;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_38;
  
  lVar2 = *(long *)(*(long *)in + -0x18);
  uVar1 = *(uint *)(in + lVar2 + 0x18);
  *(uint *)(in + lVar2 + 0x18) = uVar1 & 0xffffefff;
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::multi_pass(&mStack_48,in);
  local_38.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = (shared<std::basic_istream<char,_std::char_traits<char>_>_> *)0x0;
  local_38.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       (multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
        )(unique<char>)0x0;
  bVar3 = read<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
                    ((basic_istream_iterator<char,_std::char_traits<char>_> *)&mStack_48,
                     (basic_istream_iterator<char,_std::char_traits<char>_> *)&local_38,entries,
                     (enable_if<boost::is_same<bibtex::BibTeXEntry,_bibtex::BibTeXEntry>,_void> *)
                     0x0);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_38);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&mStack_48);
  *(uint *)(in + lVar2 + 0x18) = uVar1;
  return bVar3;
}

Assistant:

inline bool read(std::basic_istream<E, T>& in, Container& entries)
{
    boost::io::ios_flags_saver saver(in);
    in.unsetf(std::ios_base::skipws);

    typedef boost::spirit::basic_istream_iterator<E> istream_iterator;
    return read(istream_iterator(in), istream_iterator(), entries);
}